

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.h
# Opt level: O2

void __thiscall
serial::IOException::IOException(IOException *this,string *file,int line,char *description)

{
  ostream *poVar1;
  stringstream ss;
  string asStack_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  *(undefined ***)this = &PTR__IOException_00124938;
  std::__cxx11::string::string((string *)&this->file_,(string *)file);
  this->line_ = line;
  (this->e_what_)._M_dataplus._M_p = (pointer)&(this->e_what_).field_2;
  (this->e_what_)._M_string_length = 0;
  (this->e_what_).field_2._M_local_buf[0] = '\0';
  this->errno_ = 0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,"IO Exception: ");
  std::operator<<(poVar1,description);
  poVar1 = std::operator<<(local_1a8,", file ");
  poVar1 = std::operator<<(poVar1,(string *)&this->file_);
  poVar1 = std::operator<<(poVar1,", line ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->line_);
  std::operator<<(poVar1,".");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->e_what_,asStack_1d8);
  std::__cxx11::string::~string(asStack_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

explicit IOException (std::string file, int line, const char * description)
    : file_(file), line_(line), errno_(0) {
      std::stringstream ss;
      ss << "IO Exception: " << description;
      ss << ", file " << file_ << ", line " << line_ << ".";
      e_what_ = ss.str();
  }